

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retnode.cpp
# Opt level: O3

void __thiscall RetNode::print(RetNode *this)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[label=\"Ret\"];",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--",2);
  (*((this->toReturn)._M_t.super___uniq_ptr_impl<ASTNode,_std::default_delete<ASTNode>_>._M_t.
     super__Tuple_impl<0UL,_ASTNode_*,_std::default_delete<ASTNode>_>.
     super__Head_base<0UL,_ASTNode_*,_false>._M_head_impl)->_vptr_ASTNode[4])();
  return;
}

Assistant:

void RetNode::print() {
    std::cout << currentNode << ";" << std::endl;
    std::cout << currentNode << "[label=\"Ret\"];" << std::endl;
    std::cout << currentNode << "--"; toReturn->print();
}